

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<unsigned_long,long>::
Update<duckdb::BitpackingCompressionState<unsigned_long,false,long>::BitpackingWriter>
          (BitpackingState<unsigned_long,long> *this,unsigned_long value,bool is_valid)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = *(long *)(this + 0x8810);
  this[lVar2 + 0x8010] = (BitpackingState<unsigned_long,long>)is_valid;
  this[0x8860] = (BitpackingState<unsigned_long,long>)((byte)this[0x8860] & is_valid);
  this[0x8861] = (BitpackingState<unsigned_long,long>)((byte)this[0x8861] & !is_valid);
  if (is_valid) {
    *(unsigned_long *)(*(long *)(this + 0x4008) + lVar2 * 8) = value;
    uVar3 = *(ulong *)(this + 0x8828);
    if (value <= *(ulong *)(this + 0x8828)) {
      uVar3 = value;
    }
    lVar2 = *(long *)(this + 0x8810);
    *(ulong *)(this + 0x8828) = uVar3;
    if (value < *(ulong *)(this + 0x8830)) {
      value = *(ulong *)(this + 0x8830);
    }
    *(unsigned_long *)(this + 0x8830) = value;
  }
  *(long *)(this + 0x8810) = lVar2 + 1;
  if (lVar2 + 1 == 0x800) {
    bVar1 = Flush<duckdb::BitpackingCompressionState<unsigned_long,false,long>::BitpackingWriter>
                      (this);
    *(undefined8 *)(this + 0x8828) = 0xffffffffffffffff;
    *(undefined8 *)(this + 0x8840) = 0x7fffffffffffffff;
    *(undefined8 *)(this + 0x8830) = 0;
    *(undefined8 *)(this + 0x8838) = 0;
    *(undefined8 *)(this + 0x8848) = 0x8000000000000000;
    *(undefined4 *)(this + 0x8860) = 0x101;
    *(undefined8 *)(this + 0x8810) = 0;
    *(undefined8 *)(this + 0x8850) = 0;
    *(undefined8 *)(this + 0x8858) = 0;
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}